

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_XYZfunctions.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionPosition_XYZfunctions::ChFunctionPosition_XYZfunctions
          (ChFunctionPosition_XYZfunctions *this,ChFunctionPosition_XYZfunctions *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_ChFunctionPosition)._vptr_ChFunctionPosition =
       (_func_int **)&PTR__ChFunctionPosition_XYZfunctions_011926c8;
  (this->px).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->px).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->py).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->py).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->py).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->py).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar1 = (*((other->px).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->px).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar1 = (*((other->py).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_00,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->py).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar1 = (*((other->pz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_01,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->pz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChFunctionPosition_XYZfunctions::ChFunctionPosition_XYZfunctions(const ChFunctionPosition_XYZfunctions& other) {

	this->px = std::shared_ptr<ChFunction>(other.px->Clone());
	this->py = std::shared_ptr<ChFunction>(other.py->Clone());
	this->pz = std::shared_ptr<ChFunction>(other.pz->Clone());
}